

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void restore_state_to_opc_mips
               (CPUMIPSState *env,TranslationBlock_conflict *tb,target_ulong_conflict *data)

{
  uint uVar1;
  target_ulong_conflict *data_local;
  TranslationBlock_conflict *tb_local;
  CPUMIPSState *env_local;
  
  (env->active_tc).PC = *data;
  env->hflags = env->hflags & 0xff7807ff;
  env->hflags = env->hflags | data[1];
  uVar1 = env->hflags & 0x803800;
  if (((uVar1 == 0x800) || (uVar1 == 0x1000)) || (uVar1 == 0x1800)) {
    env->btarget = data[2];
  }
  return;
}

Assistant:

void restore_state_to_opc(CPUMIPSState *env, TranslationBlock *tb,
                          target_ulong *data)
{
    env->active_tc.PC = data[0];
    env->hflags &= ~MIPS_HFLAG_BMASK;
    env->hflags |= data[1];
    switch (env->hflags & MIPS_HFLAG_BMASK_BASE) {
    case MIPS_HFLAG_BR:
        break;
    case MIPS_HFLAG_BC:
    case MIPS_HFLAG_BL:
    case MIPS_HFLAG_B:
        env->btarget = data[2];
        break;
    }
}